

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t k;
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Precalculations pre;
  TravRayK<4,_true> tray;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      intersectCoherent(valid_i,This,ray,context);
      return;
    }
    auVar1 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar1 = vpcmpeqd_avx(auVar1,(undefined1  [16])valid_i->field_0);
    uVar2 = vmovmskps_avx(auVar1);
    if (uVar2 != 0) {
      uVar3 = (ulong)(uVar2 & 0xff);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar9._8_4_ = 0x7fffffff;
      auVar9._0_8_ = 0x7fffffff7fffffff;
      auVar9._12_4_ = 0x7fffffff;
      auVar4 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar9);
      auVar12._8_4_ = 0x219392ef;
      auVar12._0_8_ = 0x219392ef219392ef;
      auVar12._12_4_ = 0x219392ef;
      auVar5 = vcmpps_avx(auVar4,auVar12,1);
      auVar14._8_4_ = 0x3f800000;
      auVar14._0_8_ = 0x3f8000003f800000;
      auVar14._12_4_ = 0x3f800000;
      auVar7 = vdivps_avx(auVar14,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar4 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar9);
      auVar6 = vcmpps_avx(auVar4,auVar12,1);
      auVar8 = vdivps_avx(auVar14,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar4 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar9);
      auVar4 = vcmpps_avx(auVar4,auVar12,1);
      auVar13._8_4_ = 0x5d5e0b6b;
      auVar13._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar13._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar7,auVar13,auVar5);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar8,auVar13,auVar6);
      auVar5 = vdivps_avx(auVar14,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar5,auVar13,auVar4);
      auVar8 = ZEXT816(0) << 0x20;
      auVar4 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar8,1);
      auVar10._8_4_ = 0x20;
      auVar10._0_8_ = 0x2000000020;
      auVar10._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar4,auVar10);
      auVar4 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar8,5);
      auVar5._8_4_ = 0x40;
      auVar5._0_8_ = 0x4000000040;
      auVar5._12_4_ = 0x40;
      auVar11._8_4_ = 0x60;
      auVar11._0_8_ = 0x6000000060;
      auVar11._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar11,auVar5,auVar4);
      auVar4 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar8,5);
      auVar6._8_4_ = 0x80;
      auVar6._0_8_ = 0x8000000080;
      auVar6._12_4_ = 0x80;
      auVar7._8_4_ = 0xa0;
      auVar7._0_8_ = 0xa0000000a0;
      auVar7._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar7,auVar6,auVar4);
      auVar4 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar8);
      auVar5 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar8);
      auVar8._8_4_ = 0x7f800000;
      auVar8._0_8_ = 0x7f8000007f800000;
      auVar8._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar8,auVar4,auVar1);
      auVar4._8_4_ = 0xff800000;
      auVar4._0_8_ = 0xff800000ff800000;
      auVar4._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar4,auVar5,auVar1);
      do {
        k = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> k & 1) == 0; k = k + 1) {
          }
        }
        intersect1(This,bvh,(NodeRef)(bvh->root).ptr,k,&pre,ray,&tray,context);
        uVar3 = uVar3 & uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }